

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>::Unarchive
          (FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_> *this,MemIOReader *Reader)

{
  bool bVar1;
  ui32_t i;
  uint uVar2;
  ui32_t item_count;
  ui32_t item_size;
  value_type tmp_item;
  uint local_60;
  ui32_t local_5c;
  FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_> *local_58;
  Identifier<16U> local_50;
  
  local_58 = this;
  bVar1 = Kumu::MemIOReader::ReadUi32BE(Reader,&local_60);
  if ((!bVar1) || (bVar1 = Kumu::MemIOReader::ReadUi32BE(Reader,&local_5c), !bVar1)) {
    return false;
  }
  uVar2 = 0;
  if ((local_60 != 0) && (local_5c != 0x10)) {
    return false;
  }
  local_58 = (FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_> *)
             &(local_58->super_PushSet<Kumu::UUID>).
              super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>;
  bVar1 = true;
  while( true ) {
    if (bVar1 == false) {
      return false;
    }
    if (local_60 <= uVar2) break;
    local_50.m_HasValue = false;
    local_50.m_Value[0] = '\0';
    local_50.m_Value[1] = '\0';
    local_50.m_Value[2] = '\0';
    local_50.m_Value[3] = '\0';
    local_50.m_Value[4] = '\0';
    local_50.m_Value[5] = '\0';
    local_50.m_Value[6] = '\0';
    local_50.m_Value[7] = '\0';
    local_50.m_Value[8] = '\0';
    local_50.m_Value[9] = '\0';
    local_50.m_Value[10] = '\0';
    local_50.m_Value[0xb] = '\0';
    local_50.m_Value[0xc] = '\0';
    local_50.m_Value[0xd] = '\0';
    local_50.m_Value[0xe] = '\0';
    local_50.m_Value[0xf] = '\0';
    local_50.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00216010;
    bVar1 = Kumu::Identifier<16U>::Unarchive(&local_50,Reader);
    if (bVar1) {
      std::
      _Rb_tree<Kumu::UUID,Kumu::UUID,std::_Identity<Kumu::UUID>,std::less<Kumu::UUID>,std::allocator<Kumu::UUID>>
      ::_M_insert_unique<Kumu::UUID_const&>
                ((_Rb_tree<Kumu::UUID,Kumu::UUID,std::_Identity<Kumu::UUID>,std::less<Kumu::UUID>,std::allocator<Kumu::UUID>>
                  *)local_58,(UUID *)&local_50);
    }
    uVar2 = uVar2 + 1;
  }
  return bVar1;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }